

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JacobiSVD.h
# Opt level: O3

JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> * __thiscall
Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::compute
          (JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *this,MatrixType *matrix,
          uint computationOptions)

{
  SingularValuesType *pSVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  Index dstRows;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  float *pfVar8;
  JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *pJVar9;
  float *pfVar10;
  bool *pbVar11;
  float *pfVar12;
  JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *pJVar13;
  undefined1 *puVar14;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  float c;
  Scalar SVar18;
  undefined1 auVar19 [16];
  float s;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  Packet4f res;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ActualDstType actualDst;
  JacobiRotation<float> j_right;
  Scalar elements [4];
  JacobiRotation<float> local_c8;
  float *local_c0;
  JacobiRotation<float> local_b8;
  undefined8 uStack_b0;
  SingularValuesType *local_a0;
  ulong local_98;
  undefined8 local_88;
  float *local_80;
  undefined1 *local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  allocate(this,3,3,computationOptions);
  auVar19 = *(undefined1 (*) [16])
             (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array;
  fVar21 = ABS(auVar19._0_4_);
  fVar22 = ABS(auVar19._8_4_);
  fVar23 = ABS(auVar19._12_4_);
  auVar26._0_8_ =
       *(ulong *)((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array + 4) & 0x7fffffff7fffffff;
  auVar26._8_4_ =
       ABS((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6]);
  auVar26._12_4_ =
       ABS((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7]);
  uVar16 = -(uint)NAN(fVar21);
  uVar17 = -(uint)NAN(ABS(auVar19._4_4_));
  auVar25._8_4_ = fVar22;
  auVar25._0_8_ = auVar19._0_8_ & 0x7fffffff7fffffff;
  auVar25._12_4_ = fVar23;
  auVar26 = maxps(auVar25,auVar26);
  local_b8.m_s = (float)(~uVar17 & auVar26._4_4_ | (uint)ABS(auVar19._4_4_) & uVar17);
  local_b8.m_c = (float)(~uVar16 & auVar26._0_4_ | (uint)fVar21 & uVar16);
  uStack_b0 = CONCAT44(~-(uint)NAN(fVar23) & auVar26._12_4_ | (uint)fVar23 & -(uint)NAN(fVar23),
                       ~-(uint)NAN(fVar22) & auVar26._8_4_ | (uint)fVar22 & -(uint)NAN(fVar22));
  uVar4 = 2;
  do {
    uVar7 = 0;
    do {
      fVar21 = (&local_b8.m_c)[uVar7];
      fVar22 = (&local_b8.m_c)[uVar4 + uVar7];
      fVar23 = fVar22;
      if (fVar22 <= fVar21) {
        fVar23 = fVar21;
      }
      (&local_b8.m_c)[uVar7] =
           (float)(-(uint)NAN(fVar21) & (uint)fVar21 |
                  ~-(uint)NAN(fVar21) &
                  (~-(uint)NAN(fVar22) & (uint)fVar23 | -(uint)NAN(fVar22) & (uint)fVar22));
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
    bVar15 = 1 < uVar4;
    uVar4 = uVar4 >> 1;
  } while (bVar15);
  fVar21 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8];
  fVar22 = ABS(fVar21);
  uVar16 = -(uint)NAN(fVar21);
  fVar21 = fVar22;
  if (fVar22 <= local_b8.m_c) {
    fVar21 = local_b8.m_c;
  }
  uStack_54 = 0;
  fVar21 = (float)(-(uint)NAN(local_b8.m_c) & (uint)local_b8.m_c |
                  ~-(uint)NAN(local_b8.m_c) & (~uVar16 & (uint)fVar21 | uVar16 & (uint)fVar22));
  if (0x7f7fffff < (uint)ABS(fVar21)) {
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isInitialized
         = true;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_info =
         InvalidInput;
    return this;
  }
  local_58 = (float)(~-(uint)(fVar21 == 0.0) & (uint)fVar21 | -(uint)(fVar21 == 0.0) & 0x3f800000);
  lVar5 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_rows;
  uStack_50 = 0;
  uStack_4c = 0;
  if (lVar5 != (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_cols) {
    auVar20._4_4_ = local_58;
    auVar20._0_4_ = local_58;
    auVar20._8_4_ = local_58;
    auVar20._12_4_ = local_58;
    auVar19 = divps(auVar19,auVar20);
    *(undefined1 (*) [16])
     (this->m_scaledMatrix).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
     m_data.array = auVar19;
    auVar19 = divps(*(undefined1 (*) [16])
                     ((matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array + 4),auVar20);
    *(undefined1 (*) [16])
     ((this->m_scaledMatrix).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
      m_data.array + 4) = auVar19;
    (this->m_scaledMatrix).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[8] =
         (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
         array[8] / local_58;
    fVar21 = *(float *)&(this->
                        super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                        field_0x8c;
    fVar22 = *(float *)&this->field_0x9c;
    fVar23 = *(float *)&this->field_0xac;
    uVar4 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
            m_diagSize;
    goto LAB_0015a2e4;
  }
  uVar4 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
          m_diagSize;
  if ((long)uVar4 < 0) {
    pcVar6 = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<float, 3, 3>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<float, 3, 3>>, Level = 0]"
    ;
LAB_0015a893:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                  ,0xb2,pcVar6);
  }
  if (3 < uVar4) {
    pcVar6 = 
    "Eigen::Block<const Eigen::Matrix<float, 3, 3>>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<float, 3, 3>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
    ;
LAB_0015a8b2:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                  ,0x93,pcVar6);
  }
  if (uVar4 != 3) goto LAB_0015a8bc;
  fVar21 = auVar19._0_4_ / local_58;
  *(float *)&(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             field_0x8c = fVar21;
  *(float *)&this->field_0x90 =
       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [1] / local_58;
  *(float *)&this->field_0x94 =
       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [2] / local_58;
  *(float *)&this->field_0x98 =
       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [3] / local_58;
  fVar22 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[4] / local_58;
  *(float *)&this->field_0x9c = fVar22;
  *(float *)&this->field_0xa0 =
       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [5] / local_58;
  *(float *)&this->field_0xa4 =
       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [6] / local_58;
  *(float *)&this->field_0xa8 =
       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [7] / local_58;
  fVar23 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8] / local_58;
  *(float *)&this->field_0xac = fVar23;
  if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
      m_computeFullU == true) {
    if (lVar5 != 3) goto LAB_0015a8bc;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
    if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_computeThinU != false) goto LAB_0015a262;
  }
  else if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
           m_computeThinU != false) {
    if (lVar5 != 3) goto LAB_0015a8bc;
LAB_0015a262:
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
  }
  if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
      m_computeFullV == true) {
    if (lVar5 != 3) {
LAB_0015a8bc:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<float, 3, 3>>::resize(Index, Index) [Derived = Eigen::Matrix<float, 3, 3>]"
                   );
    }
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
    (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
    super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
    uVar4 = 3;
    if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_computeThinV == false) goto LAB_0015a2e4;
  }
  else {
    uVar4 = 3;
    if ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_computeThinV == false) goto LAB_0015a2e4;
    if (lVar5 != 3) goto LAB_0015a8bc;
  }
  uVar4 = 3;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
LAB_0015a2e4:
  pfVar10 = (float *)&(this->
                      super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                      field_0x8c;
  fVar24 = ABS(fVar23);
  if (ABS(fVar23) <= ABS(fVar22)) {
    fVar24 = ABS(fVar22);
  }
  if (fVar24 <= ABS(fVar21)) {
    fVar24 = ABS(fVar21);
  }
  local_78 = &this->field_0x90;
  local_80 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array + 3;
  local_70 = pfVar10;
  do {
    if ((long)uVar4 < 2) break;
    uVar7 = 1;
    bVar15 = true;
    pJVar9 = this;
    pfVar8 = local_80;
    puVar14 = local_78;
    do {
      local_c0 = pfVar10 + uVar7 * 3;
      uVar4 = 0;
      pfVar12 = pfVar10;
      pJVar13 = this;
      local_68 = pfVar8;
      do {
        fVar21 = fVar24 * 2.3841858e-07;
        if (fVar21 <= 1.1754944e-38) {
          fVar21 = 1.1754944e-38;
        }
        if ((fVar21 < ABS((pfVar10 + uVar4 * 3)[uVar7])) || (fVar21 < ABS(local_c0[uVar4]))) {
          uStack_44 = 0;
          uStack_40 = 0;
          uStack_3c = 0;
          local_60 = pfVar10 + uVar4 * 3;
          local_48 = fVar24;
          internal::real_2x2_jacobi_svd<Eigen::Matrix<float,3,3,0,3,3>,float,long>
                    ((Matrix<float,_3,_3,_0,_3,_3> *)pfVar10,uVar7,uVar4,&local_b8,&local_c8);
          if (2 < uVar7) {
            pcVar6 = 
            "Eigen::Block<Eigen::Matrix<float, 3, 3>, 1, 3>::Block(XprType &, Index) [XprType = Eigen::Matrix<float, 3, 3>, BlockRows = 1, BlockCols = 3, InnerPanel = false]"
            ;
            goto LAB_0015a85d;
          }
          if (local_b8.m_c != 1.0 || local_b8.m_s != 0.0) {
            lVar5 = 0;
            do {
              fVar21 = *(float *)(puVar14 + lVar5);
              fVar22 = *(float *)((long)pfVar12 + lVar5);
              *(float *)(puVar14 + lVar5) = local_b8.m_c * fVar21 + local_b8.m_s * fVar22;
              *(float *)((long)pfVar12 + lVar5) = fVar21 * -local_b8.m_s + fVar22 * local_b8.m_c;
              lVar5 = lVar5 + 0xc;
            } while (lVar5 != 0x24);
            if ((((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_computeFullU != false) ||
                (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_computeThinU & 1U) != 0)) && (local_b8.m_c != 1.0 || local_b8.m_s != 0.0)) {
              lVar5 = 0;
              do {
                fVar21 = local_68[lVar5];
                fVar22 = (pJVar13->
                         super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                         m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[lVar5];
                local_68[lVar5] = local_b8.m_c * fVar21 + local_b8.m_s * fVar22;
                (pJVar13->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[lVar5] = fVar21 * -local_b8.m_s + fVar22 * local_b8.m_c;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 3);
            }
          }
          fVar21 = -local_c8.m_s;
          if (((local_c8.m_s != fVar21) || (NAN(local_c8.m_s) || NAN(fVar21))) ||
             ((local_c8.m_c != 1.0 || (NAN(local_c8.m_c))))) {
            lVar5 = 0x23;
            do {
              fVar22 = (pJVar9->
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                       m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[lVar5 + 3];
              fVar23 = (pJVar13->
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                       m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[lVar5];
              (pJVar9->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[lVar5 + 3] = local_c8.m_c * fVar22 + fVar23 * fVar21;
              (pJVar13->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[lVar5] = fVar22 * local_c8.m_s + fVar23 * local_c8.m_c;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x26);
            if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeFullV != false) ||
               (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                 m_computeThinV & 1U) != 0)) {
              lVar5 = 9;
              do {
                fVar22 = (pJVar9->
                         super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                         m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[lVar5 + 3];
                fVar23 = (pJVar13->
                         super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                         m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[lVar5];
                (pJVar9->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[lVar5 + 3] = local_c8.m_c * fVar22 + fVar23 * fVar21;
                (pJVar13->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[lVar5] = fVar22 * local_c8.m_s + fVar23 * local_c8.m_c;
                lVar5 = lVar5 + 1;
              } while (lVar5 != 0xc);
            }
          }
          fVar24 = ABS(local_60[uVar4]);
          if (ABS(local_60[uVar4]) <= ABS(local_c0[uVar7])) {
            fVar24 = ABS(local_c0[uVar7]);
          }
          if (fVar24 <= local_48) {
            fVar24 = local_48;
          }
          bVar15 = false;
          pfVar8 = local_68;
          pfVar10 = local_70;
        }
        uVar4 = uVar4 + 1;
        pfVar12 = pfVar12 + 1;
        pJVar13 = (JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)
                  ((pJVar13->
                   super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array + 3);
      } while (uVar4 != uVar7);
      uVar7 = uVar7 + 1;
      uVar4 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_diagSize;
      puVar14 = puVar14 + 4;
      pfVar8 = pfVar8 + 3;
      pJVar9 = (JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> *)
               ((pJVar9->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array + 3);
    } while ((long)uVar7 < (long)uVar4);
  } while (!bVar15);
  if (0 < (long)uVar4) {
    bVar15 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_computeFullU;
    pfVar8 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array + 2;
    uVar7 = 0;
    do {
      fVar21 = *pfVar10;
      (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
      m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[uVar7] = ABS(fVar21);
      if ((fVar21 < 0.0) &&
         ((((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
            m_computeThinU | bVar15) & 1U) != 0)) {
        if (2 < uVar7) goto LAB_0015a867;
        *(ulong *)((plain_array<float,_9,_0,_0> *)(pfVar8 + -2))->array =
             *(ulong *)((plain_array<float,_9,_0,_0> *)(pfVar8 + -2))->array ^ 0x8000000080000000;
        *pfVar8 = -*pfVar8;
      }
      uVar7 = uVar7 + 1;
      pfVar8 = pfVar8 + 3;
      pfVar10 = pfVar10 + 4;
    } while (uVar4 != uVar7);
  }
  uVar3 = *(undefined8 *)
           (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
           m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_singularValues.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_58 * (float)uVar3;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_singularValues.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_58 * (float)((ulong)uVar3 >> 0x20);
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_singularValues.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data
       .array[2] * local_58;
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
  m_nonzeroSingularValues = uVar4;
  if (0 < (long)uVar4) {
    pSVar1 = &(this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_singularValues;
    pbVar11 = (bool *)&(this->
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                       m_info;
    pfVar10 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array + 2;
    lVar5 = 0;
    uVar7 = 0;
    do {
      local_b8 = (JacobiRotation<float>)((long)pbVar11 + uVar4 * -4);
      uStack_b0 = uVar4 + lVar5;
      if ((long)uStack_b0 < 0) {
        pcVar6 = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, 3, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, 3, 1>, -1, 1>, Level = 0]"
        ;
        goto LAB_0015a893;
      }
      local_98 = (uVar7 - uVar4) + 3;
      local_88 = 3;
      local_a0 = pSVar1;
      if ((long)(local_98 | uStack_b0) < 0) {
        pcVar6 = 
        "Eigen::Block<Eigen::Matrix<float, 3, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<float, 3, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_0015a8b2;
      }
      SVar18 = DenseBase<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,-1,1,false>>::maxCoeff<0,long>
                         ((DenseBase<Eigen::Block<Eigen::Matrix<float,3,1,0,3,1>,_1,1,false>> *)
                          &local_b8,(long *)&local_c8);
      if ((SVar18 == 0.0) && (!NAN(SVar18))) {
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_nonzeroSingularValues = uVar7;
        break;
      }
      if (local_c8 != (JacobiRotation<float>)0x0) {
        local_c8 = (JacobiRotation<float>)((long)local_c8 + uVar7);
        fVar21 = (((SingularValuesType *)(pbVar11 + -0xc))->
                 super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
                 [0];
        (((SingularValuesType *)(pbVar11 + -0xc))->
        super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
             (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[(long)local_c8];
        (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[(long)local_c8] = fVar21;
        if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_computeFullU != false) ||
           (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_computeThinU & 1U) != 0)) {
          if ((2 < (ulong)local_c8) || (2 < uVar7)) {
LAB_0015a867:
            pcVar6 = 
            "Eigen::Block<Eigen::Matrix<float, 3, 3>, 3, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<float, 3, 3>, BlockRows = 3, BlockCols = 1, InnerPanel = true]"
            ;
LAB_0015a85d:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Block.h"
                          ,0x7a,pcVar6);
          }
          uVar3 = *(undefined8 *)(pfVar10 + -0xb);
          pfVar10[-0xb] =
               (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[(long)local_c8 * 3];
          uVar2 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[(long)local_c8 * 3U + 1];
          *(undefined8 *)
           ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
            m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + (long)local_c8 * 3) = uVar3;
          pfVar10[-10] = (float)uVar2;
          uVar2 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[(long)local_c8 * 3U + 2];
          (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixU
          .super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [(long)local_c8 * 3U + 2] = pfVar10[-9];
          pfVar10[-9] = (float)uVar2;
        }
        if (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_computeFullV != false) ||
           (((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
             m_computeThinV & 1U) != 0)) {
          if ((2 < (ulong)local_c8) || (2 < uVar7)) goto LAB_0015a867;
          uVar3 = *(undefined8 *)((plain_array<float,_9,_0,_0> *)(pfVar10 + -2))->array;
          ((plain_array<float,_9,_0,_0> *)(pfVar10 + -2))->array[0] =
               (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
               m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[(long)local_c8 * 3];
          fVar21 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                   m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[(long)local_c8 * 3U + 1];
          *(undefined8 *)
           ((this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
            m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + (long)local_c8 * 3) = uVar3;
          pfVar10[-1] = fVar21;
          fVar21 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
                   m_matrixV.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[(long)local_c8 * 3U + 2];
          (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_matrixV
          .super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          [(long)local_c8 * 3U + 2] = *pfVar10;
          *pfVar10 = fVar21;
        }
      }
      uVar7 = uVar7 + 1;
      uVar4 = (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).
              m_diagSize;
      lVar5 = lVar5 + -1;
      pbVar11 = pbVar11 + 4;
      pfVar10 = pfVar10 + 3;
    } while ((long)uVar7 < (long)uVar4);
  }
  (this->super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>).m_isInitialized =
       true;
  return this;
}

Assistant:

JacobiSVD<MatrixType, QRPreconditioner>&
JacobiSVD<MatrixType, QRPreconditioner>::compute(const MatrixType& matrix, unsigned int computationOptions)
{
  using std::abs;
  allocate(matrix.rows(), matrix.cols(), computationOptions);

  // currently we stop when we reach precision 2*epsilon as the last bit of precision can require an unreasonable number of iterations,
  // only worsening the precision of U and V as we accumulate more rotations
  const RealScalar precision = RealScalar(2) * NumTraits<Scalar>::epsilon();

  // limit for denormal numbers to be considered zero in order to avoid infinite loops (see bug 286)
  const RealScalar considerAsZero = (std::numeric_limits<RealScalar>::min)();

  // Scaling factor to reduce over/under-flows
  RealScalar scale = matrix.cwiseAbs().template maxCoeff<PropagateNaN>();
  if (!(numext::isfinite)(scale)) {
    m_isInitialized = true;
    m_info = InvalidInput;
    return *this;
  }
  if(scale==RealScalar(0)) scale = RealScalar(1);
  
  /*** step 1. The R-SVD step: we use a QR decomposition to reduce to the case of a square matrix */

  if(m_rows!=m_cols)
  {
    m_scaledMatrix = matrix / scale;
    m_qr_precond_morecols.run(*this, m_scaledMatrix);
    m_qr_precond_morerows.run(*this, m_scaledMatrix);
  }
  else
  {
    m_workMatrix = matrix.block(0,0,m_diagSize,m_diagSize) / scale;
    if(m_computeFullU) m_matrixU.setIdentity(m_rows,m_rows);
    if(m_computeThinU) m_matrixU.setIdentity(m_rows,m_diagSize);
    if(m_computeFullV) m_matrixV.setIdentity(m_cols,m_cols);
    if(m_computeThinV) m_matrixV.setIdentity(m_cols, m_diagSize);
  }

  /*** step 2. The main Jacobi SVD iteration. ***/
  RealScalar maxDiagEntry = m_workMatrix.cwiseAbs().diagonal().maxCoeff();

  bool finished = false;
  while(!finished)
  {
    finished = true;

    // do a sweep: for all index pairs (p,q), perform SVD of the corresponding 2x2 sub-matrix

    for(Index p = 1; p < m_diagSize; ++p)
    {
      for(Index q = 0; q < p; ++q)
      {
        // if this 2x2 sub-matrix is not diagonal already...
        // notice that this comparison will evaluate to false if any NaN is involved, ensuring that NaN's don't
        // keep us iterating forever. Similarly, small denormal numbers are considered zero.
        RealScalar threshold = numext::maxi<RealScalar>(considerAsZero, precision * maxDiagEntry);
        if(abs(m_workMatrix.coeff(p,q))>threshold || abs(m_workMatrix.coeff(q,p)) > threshold)
        {
          finished = false;
          // perform SVD decomposition of 2x2 sub-matrix corresponding to indices p,q to make it diagonal
          // the complex to real operation returns true if the updated 2x2 block is not already diagonal
          if(internal::svd_precondition_2x2_block_to_be_real<MatrixType, QRPreconditioner>::run(m_workMatrix, *this, p, q, maxDiagEntry))
          {
            JacobiRotation<RealScalar> j_left, j_right;
            internal::real_2x2_jacobi_svd(m_workMatrix, p, q, &j_left, &j_right);

            // accumulate resulting Jacobi rotations
            m_workMatrix.applyOnTheLeft(p,q,j_left);
            if(computeU()) m_matrixU.applyOnTheRight(p,q,j_left.transpose());

            m_workMatrix.applyOnTheRight(p,q,j_right);
            if(computeV()) m_matrixV.applyOnTheRight(p,q,j_right);

            // keep track of the largest diagonal coefficient
            maxDiagEntry = numext::maxi<RealScalar>(maxDiagEntry,numext::maxi<RealScalar>(abs(m_workMatrix.coeff(p,p)), abs(m_workMatrix.coeff(q,q))));
          }
        }
      }
    }
  }

  /*** step 3. The work matrix is now diagonal, so ensure it's positive so its diagonal entries are the singular values ***/

  for(Index i = 0; i < m_diagSize; ++i)
  {
    // For a complex matrix, some diagonal coefficients might note have been
    // treated by svd_precondition_2x2_block_to_be_real, and the imaginary part
    // of some diagonal entry might not be null.
    if(NumTraits<Scalar>::IsComplex && abs(numext::imag(m_workMatrix.coeff(i,i)))>considerAsZero)
    {
      RealScalar a = abs(m_workMatrix.coeff(i,i));
      m_singularValues.coeffRef(i) = abs(a);
      if(computeU()) m_matrixU.col(i) *= m_workMatrix.coeff(i,i)/a;
    }
    else
    {
      // m_workMatrix.coeff(i,i) is already real, no difficulty:
      RealScalar a = numext::real(m_workMatrix.coeff(i,i));
      m_singularValues.coeffRef(i) = abs(a);
      if(computeU() && (a<RealScalar(0))) m_matrixU.col(i) = -m_matrixU.col(i);
    }
  }
  
  m_singularValues *= scale;

  /*** step 4. Sort singular values in descending order and compute the number of nonzero singular values ***/

  m_nonzeroSingularValues = m_diagSize;
  for(Index i = 0; i < m_diagSize; i++)
  {
    Index pos;
    RealScalar maxRemainingSingularValue = m_singularValues.tail(m_diagSize-i).maxCoeff(&pos);
    if(maxRemainingSingularValue == RealScalar(0))
    {
      m_nonzeroSingularValues = i;
      break;
    }
    if(pos)
    {
      pos += i;
      std::swap(m_singularValues.coeffRef(i), m_singularValues.coeffRef(pos));
      if(computeU()) m_matrixU.col(pos).swap(m_matrixU.col(i));
      if(computeV()) m_matrixV.col(pos).swap(m_matrixV.col(i));
    }
  }

  m_isInitialized = true;
  return *this;
}